

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEvaluator.cpp
# Opt level: O0

void __thiscall
simpleExpressionEvaluator::ExpressionEvaluator::ExpressionEvaluator(ExpressionEvaluator *this)

{
  VariableTable local_40;
  ExpressionEvaluator *local_10;
  ExpressionEvaluator *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  VariableTable::VariableTable(&this->_variableTable);
  memset(&local_40,0,0x30);
  VariableTable::VariableTable(&local_40);
  VariableTable::operator=(&this->_variableTable,&local_40);
  VariableTable::~VariableTable(&local_40);
  this->_index = -1;
  return;
}

Assistant:

ExpressionEvaluator::ExpressionEvaluator()
{
	_variableTable = VariableTable();
	_index = -1;
}